

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

void leb_ComputeSumReduction(leb_Heap *leb)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint32_t tmp1;
  uint uVar8;
  uint uVar9;
  leb_Node lVar10;
  leb_Node node;
  leb_Node node_00;
  leb_Node node_01;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int local_60;
  long local_58;
  
  iVar1 = leb->maxDepth;
  uVar3 = 1 << ((byte)iVar1 & 0x1f);
  uVar8 = 2 << ((byte)iVar1 & 0x1f);
  if (uVar3 < uVar8) {
    uVar12 = uVar3;
    do {
      uVar4 = ((leb->maxDepth - iVar1) + 1) * uVar12 + uVar8;
      uVar9 = leb->buffer[uVar4 >> 5];
      uVar9 = (uVar9 >> 1 & 0x55555555) + (uVar9 & 0x55555555);
      leb->buffer[uVar4 - uVar3 >> 5] = uVar9;
      uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
      lVar10.id = uVar12 >> 2;
      lVar10.depth = iVar1 + -2;
      leb__HeapWriteExplicit
                (leb,lVar10,0x18,
                 uVar9 >> 7 & 0xe00000 |
                 uVar9 >> 6 & 0x1c0000 |
                 uVar9 >> 5 & 0x38000 |
                 uVar9 >> 4 & 0x7000 |
                 uVar9 >> 3 & 0xe00 | uVar9 >> 2 & 0x1c0 | uVar9 >> 1 & 0x38 | uVar9 & 7);
      uVar9 = (uVar9 >> 4 & 0x7070707) + (uVar9 & 0x7070707);
      node.id = uVar12 >> 3;
      node.depth = iVar1 + -3;
      leb__HeapWriteExplicit
                (leb,node,0x10,
                 uVar9 >> 0xc & 0xf000 | uVar9 >> 8 & 0xf00 | (uVar9 >> 4 | uVar9) & 0xff);
      uVar9 = (uVar9 >> 8 & 0xf000f) + (uVar9 & 0xf000f);
      node_00.id = uVar12 >> 4;
      node_00.depth = iVar1 + -4;
      leb__HeapWriteExplicit(leb,node_00,10,uVar9 >> 0xb | uVar9 & 0xff);
      node_01.id = uVar12 >> 5;
      node_01.depth = iVar1 + -5;
      leb__HeapWriteExplicit(leb,node_01,6,(uVar9 >> 0x10) + (uVar9 & 0xff));
      uVar12 = uVar12 + 0x20;
    } while (uVar12 < uVar8);
  }
  if (5 < iVar1) {
    uVar11 = (ulong)(iVar1 - 5);
    local_58 = (ulong)(iVar1 - 6) << 0x20;
    uVar7 = (ulong)(iVar1 - 6);
    do {
      uVar8 = 1 << ((byte)uVar7 & 0x1f);
      uVar3 = 2 << ((byte)uVar7 & 0x1f);
      if (uVar8 < uVar3) {
        lVar10 = (leb_Node)(local_58 + (ulong)uVar8);
        uVar12 = uVar8 * 2;
        lVar13 = (ulong)uVar3 - (ulong)uVar8;
        do {
          uVar5 = leb__HeapRead(leb,(leb_Node)((ulong)uVar12 | uVar11 << 0x20));
          uVar6 = leb__HeapRead(leb,(leb_Node)((ulong)(uVar12 + 1) | uVar11 << 0x20));
          local_60 = (int)uVar7;
          leb__HeapWriteExplicit(leb,lVar10,(leb->maxDepth - local_60) + 1,uVar5 + uVar6);
          lVar10 = (leb_Node)((long)lVar10 + 1);
          uVar12 = uVar12 + 2;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      uVar11 = uVar11 - 1;
      local_58 = local_58 + -0x100000000;
      bVar2 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

LEBDEF void leb_ComputeSumReduction(leb_Heap *leb)
{
    int depth = leb->maxDepth;
    uint32_t minNodeID = (1u << depth);
    uint32_t maxNodeID = (2u << depth);

    // prepass: processes deepest levels in parallel
    for (uint32_t nodeID = minNodeID; nodeID < maxNodeID; nodeID+= 32u) {
        uint32_t alignedBitOffset = leb__NodeBitID(leb, {nodeID, depth});
        uint32_t bitField = leb->buffer[alignedBitOffset >> 5u];
        uint32_t bitData = 0u;

        // 2-bits
        bitField = (bitField & 0x55555555u) + ((bitField >> 1u) & 0x55555555u);
        bitData = bitField;
        leb->buffer[(alignedBitOffset - minNodeID) >> 5u] = bitData;

        // 3-bits
        bitField = (bitField & 0x33333333u) + ((bitField >>  2u) & 0x33333333u);
        bitData = ((bitField >> 0u) & (7u <<  0u))
                | ((bitField >> 1u) & (7u <<  3u))
                | ((bitField >> 2u) & (7u <<  6u))
                | ((bitField >> 3u) & (7u <<  9u))
                | ((bitField >> 4u) & (7u << 12u))
                | ((bitField >> 5u) & (7u << 15u))
                | ((bitField >> 6u) & (7u << 18u))
                | ((bitField >> 7u) & (7u << 21u));
        leb__HeapWriteExplicit(leb, {nodeID >> 2u, depth - 2}, 24u, bitData);

        // 4-bits
        bitField = (bitField & 0x0F0F0F0Fu) + ((bitField >>  4u) & 0x0F0F0F0Fu);
        bitData = ((bitField >>  0u) & (15u <<  0u))
                | ((bitField >>  4u) & (15u <<  4u))
                | ((bitField >>  8u) & (15u <<  8u))
                | ((bitField >> 12u) & (15u << 12u));
        leb__HeapWriteExplicit(leb, {nodeID >> 3u, depth - 3}, 16u, bitData);

        // 5-bits
        bitField = (bitField & 0x00FF00FFu) + ((bitField >>  8u) & 0x00FF00FFu);
        bitData = ((bitField >>  0u) & (31u << 0u))
                | ((bitField >> 11u) & (31u << 5u));
        leb__HeapWriteExplicit(leb, {nodeID >> 4u, depth - 4}, 10u, bitData);

        // 6-bits
        bitField = (bitField & 0x0000FFFFu) + ((bitField >> 16u) & 0x0000FFFFu);
        bitData = bitField;
        leb__HeapWriteExplicit(leb, {nodeID >> 5u, depth - 5},  6u, bitData);
    }
    depth-= 5;

    // iterate over elements atomically
    while (--depth >= 0) {
        uint32_t minNodeID = 1u << depth;
        uint32_t maxNodeID = 2u << depth;

        for (uint32_t j = minNodeID; j < maxNodeID; ++j) {
            uint32_t x0 = leb__HeapRead(leb, {j << 1u     , depth + 1});
            uint32_t x1 = leb__HeapRead(leb, {j << 1u | 1u, depth + 1});

            leb__HeapWrite(leb, {j, depth}, x0 + x1);
        }
    }
}